

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O0

void __thiscall HdlcAnalyzer::WorkerThread(HdlcAnalyzer *this)

{
  element_type *peVar1;
  HdlcAnalyzer *this_local;
  
  SetupAnalyzer(this);
  peVar1 = std::auto_ptr<HdlcAnalyzerSettings>::operator->(&this->mSettings);
  if (peVar1->mTransmissionMode == HDLC_TRANSMISSION_BIT_SYNC) {
    AnalyzerChannelData::AdvanceToNextEdge();
  }
  do {
    ProcessHDLCFrame(this);
    CommitFrames(this);
    std::vector<Frame,_std::allocator<Frame>_>::clear(&this->mResultFrames);
    std::auto_ptr<HdlcAnalyzerResults>::operator->(&this->mResults);
    AnalyzerResults::CommitResults();
    AnalyzerChannelData::GetSampleNumber();
    Analyzer::ReportProgress((ulonglong)this);
    Analyzer::CheckIfThreadShouldExit();
  } while( true );
}

Assistant:

void HdlcAnalyzer::WorkerThread()
{
    SetupAnalyzer();

    if( mSettings->mTransmissionMode == HDLC_TRANSMISSION_BIT_SYNC )
    {
        // Synchronize
        mHdlc->AdvanceToNextEdge();
    }

    // Main loop
    for( ;; )
    {
        ProcessHDLCFrame();

        CommitFrames();
        mResultFrames.clear();

        mResults->CommitResults();
        ReportProgress( mHdlc->GetSampleNumber() );
        CheckIfThreadShouldExit();
    }
}